

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

Token * __thiscall
wabt::WastLexer::BareToken(Token *__return_storage_ptr__,WastLexer *this,TokenType token_type)

{
  char *pcVar1;
  Location loc;
  uint uVar2;
  uint uVar4;
  undefined1 auVar3 [16];
  uint uVar5;
  uint uVar6;
  undefined4 uStack_c;
  
  pcVar1 = this->line_start_;
  auVar3._8_4_ = (int)pcVar1;
  auVar3._0_8_ = pcVar1;
  auVar3._12_4_ = (int)((ulong)pcVar1 >> 0x20);
  uVar2 = (int)((long)this->token_start_ - (long)pcVar1) + 1;
  uVar4 = (int)((long)this->cursor_ - auVar3._8_8_) + 1;
  uVar5 = -(uint)(1 < (int)uVar2);
  uVar6 = -(uint)(1 < (int)uVar4);
  loc.field_1.field_0.first_column = ~uVar5 & 1 | uVar2 & uVar5;
  loc.field_1.field_0.line = this->line_;
  loc.field_1._12_4_ = uStack_c;
  loc.field_1.field_0.last_column = ~uVar6 & 1 | uVar4 & uVar6;
  loc.filename._M_str = (this->filename_)._M_dataplus._M_p;
  loc.filename._M_len = (this->filename_)._M_string_length;
  Token::Token(__return_storage_ptr__,loc,token_type);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::BareToken(TokenType token_type) {
  return Token(GetLocation(), token_type);
}